

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

bool __thiscall MockNamedValue::compatibleForCopying(MockNamedValue *this,MockNamedValue *p)

{
  bool bVar1;
  SimpleString *left;
  bool local_79;
  SimpleString local_50 [2];
  SimpleString local_30;
  MockNamedValue *local_20;
  MockNamedValue *p_local;
  MockNamedValue *this_local;
  
  local_20 = p;
  p_local = this;
  bVar1 = operator==(&this->type_,&p->type_);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    SimpleString::SimpleString(&local_30,"const void*");
    bVar1 = operator==(&this->type_,&local_30);
    local_79 = false;
    if (bVar1) {
      left = &local_20->type_;
      SimpleString::SimpleString(local_50,"void*");
      local_79 = operator==(left,local_50);
      SimpleString::~SimpleString(local_50);
    }
    SimpleString::~SimpleString(&local_30);
    if (local_79 == false) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MockNamedValue::compatibleForCopying(const MockNamedValue& p) const
{
    if (type_ == p.type_) return true;

    if ((type_ == "const void*") && (p.type_ == "void*"))
        return true;

    return false;
}